

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCompactProtocol.h
# Opt level: O0

void __thiscall
duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>::TCompactProtocolT
          (TCompactProtocolT<duckdb::ThriftFileTransport> *this,
          shared_ptr<duckdb::ThriftFileTransport> *trans)

{
  element_type *peVar1;
  __shared_ptr<duckdb::ThriftFileTransport,_(__gnu_cxx::_Lock_policy)2> *in_RSI;
  stack<short,_std::deque<short,_std::allocator<short>_>_> *in_RDI;
  shared_ptr<duckdb_apache::thrift::transport::TTransport> *in_stack_ffffffffffffffe8;
  __shared_ptr<duckdb::ThriftFileTransport,_(__gnu_cxx::_Lock_policy)2> *this_00;
  
  this_00 = in_RSI;
  std::shared_ptr<duckdb_apache::thrift::transport::TTransport>::
  shared_ptr<duckdb::ThriftFileTransport,void>
            ((shared_ptr<duckdb_apache::thrift::transport::TTransport> *)in_RDI,
             (shared_ptr<duckdb::ThriftFileTransport> *)in_RSI);
  TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
  ::TVirtualProtocol((TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
                      *)this_00,in_stack_ffffffffffffffe8);
  std::shared_ptr<duckdb_apache::thrift::transport::TTransport>::~shared_ptr
            ((shared_ptr<duckdb_apache::thrift::transport::TTransport> *)0x21dcba6);
  (in_RDI->c).super__Deque_base<short,_std::allocator<short>_>._M_impl.super__Deque_impl_data._M_map
       = (_Map_pointer)&PTR__TCompactProtocolT_0353de18;
  peVar1 = std::__shared_ptr<duckdb::ThriftFileTransport,_(__gnu_cxx::_Lock_policy)2>::get(in_RSI);
  (in_RDI->c).super__Deque_base<short,_std::allocator<short>_>._M_impl.super__Deque_impl_data.
  _M_start._M_node = (_Map_pointer)peVar1;
  std::stack<short,std::deque<short,std::allocator<short>>>::
  stack<std::deque<short,std::allocator<short>>,void>(in_RDI);
  *(undefined2 *)
   &in_RDI[1].c.super__Deque_base<short,_std::allocator<short>_>._M_impl.super__Deque_impl_data.
    _M_finish._M_node = 0;
  *(undefined4 *)
   ((long)&in_RDI[1].c.super__Deque_base<short,_std::allocator<short>_>._M_impl.
           super__Deque_impl_data._M_finish._M_node + 4) = 0;
  in_RDI[2].c.super__Deque_base<short,_std::allocator<short>_>._M_impl.super__Deque_impl_data._M_map
       = (_Map_pointer)0x0;
  *(undefined4 *)
   &in_RDI[2].c.super__Deque_base<short,_std::allocator<short>_>._M_impl.super__Deque_impl_data.
    _M_map_size = 0;
  *(undefined4 *)
   ((long)&in_RDI[2].c.super__Deque_base<short,_std::allocator<short>_>._M_impl.
           super__Deque_impl_data._M_map_size + 4) = 0;
  (in_RDI->c).super__Deque_base<short,_std::allocator<short>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_cur = (_Elt_pointer)0x0;
  *(undefined1 *)
   &(in_RDI->c).super__Deque_base<short,_std::allocator<short>_>._M_impl.super__Deque_impl_data.
    _M_finish._M_last = 0;
  return;
}

Assistant:

TCompactProtocolT(std::shared_ptr<Transport_> trans)
    : TVirtualProtocol<TCompactProtocolT<Transport_> >(trans),
      trans_(trans.get()),
      lastFieldId_(0),
      string_limit_(0),
      string_buf_(nullptr),
      string_buf_size_(0),
      container_limit_(0) {
    booleanField_.name = nullptr;
    boolValue_.hasBoolValue = false;
  }